

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageRectangle(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int x1_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = im->thick;
  if ((x1 == x2) && (uVar1 == 1 && y1 == y2)) {
    gdImageSetPixel(im,x1,y1,color);
    return;
  }
  iVar8 = y1;
  if (y1 < y2) {
    iVar8 = y2;
  }
  iVar7 = y1;
  if (y2 < y1) {
    iVar7 = y2;
  }
  iVar3 = x1;
  if (x1 < x2) {
    iVar3 = x2;
  }
  x1_00 = x1;
  if (x2 < x1) {
    x1_00 = x2;
  }
  if ((int)uVar1 < 2) {
    if (x1 != x2 && y2 != y1) {
      gdImageLine(im,x1_00,iVar7,iVar3,iVar7,color);
      gdImageLine(im,x1_00,iVar8,iVar3,iVar8,color);
      iVar7 = iVar7 + 1;
      iVar8 = iVar8 + -1;
      gdImageLine(im,x1_00,iVar7,x1_00,iVar8,color);
      x1_00 = iVar3;
    }
    gdImageLine(im,x1_00,iVar7,iVar3,iVar8,color);
    return;
  }
  uVar2 = uVar1 >> 1;
  iVar3 = iVar3 + uVar2;
  iVar4 = (iVar7 - uVar2) + uVar1;
  iVar5 = iVar4;
  while ((int)(iVar7 - uVar2) < iVar5) {
    iVar5 = iVar5 + -1;
    for (iVar6 = x1_00 - uVar2; iVar6 + -1 < iVar3; iVar6 = iVar6 + 1) {
      gdImageSetPixel(im,iVar6,iVar5,color);
    }
  }
  iVar5 = (iVar8 + uVar2) - uVar1;
  iVar7 = iVar5;
  while (iVar7 < (int)(iVar8 + uVar2)) {
    iVar7 = iVar7 + 1;
    for (iVar6 = x1_00 - uVar2; iVar6 + -1 < iVar3; iVar6 = iVar6 + 1) {
      gdImageSetPixel(im,iVar6,iVar7,color);
    }
  }
  iVar4 = iVar4 + -1;
  iVar8 = iVar4;
  while (iVar8 < iVar5) {
    iVar8 = iVar8 + 1;
    for (iVar7 = x1_00 - uVar2; iVar7 + -1 < (int)((x1_00 - uVar2) + uVar1); iVar7 = iVar7 + 1) {
      gdImageSetPixel(im,iVar7,iVar8,color);
    }
  }
  while (iVar4 < iVar5) {
    iVar4 = iVar4 + 1;
    for (iVar8 = iVar3 - uVar1; iVar8 + -1 < iVar3; iVar8 = iVar8 + 1) {
      gdImageSetPixel(im,iVar8,iVar4,color);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageRectangle (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int thick = im->thick;

	if (x1 == x2 && y1 == y2 && thick == 1) {
		gdImageSetPixel(im, x1, y1, color);
		return;
	}

	if (y2 < y1) {
		int t = y1;
		y1 = y2;
		y2 = t;
	}

	if (x2 < x1) {
		int t = x1;
		x1 = x2;
		x2 = t;
	}

	if (thick > 1) {
		int cx, cy, x1ul, y1ul, x2lr, y2lr;
		int half = thick >> 1;
		x1ul = x1 - half;
		y1ul = y1 - half;

		x2lr = x2 + half;
		y2lr = y2 + half;

		cy = y1ul + thick;
		while (cy-- > y1ul) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y2lr - thick;
		while (cy++ < y2lr) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x1ul - 1;
			while (cx++ < x1ul + thick) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x2lr - thick - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		return;
	} else {
		if (x1 == x2 || y1 == y2) {
			gdImageLine(im, x1, y1, x2, y2, color);
		} else {
			gdImageLine(im, x1, y1, x2, y1, color);
			gdImageLine(im, x1, y2, x2, y2, color);
			gdImageLine(im, x1, y1 + 1, x1, y2 - 1, color);
			gdImageLine(im, x2, y1 + 1, x2, y2 - 1, color);
		}
	}
}